

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::remove_edge(Graph *this,vertex_t s,vertex_t t)

{
  uint *puVar1;
  pointer pvVar2;
  pointer puVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  vertex_t local_20;
  vertex_t local_1c;
  
  uVar7 = (ulong)s;
  pvVar2 = (this->succ_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->succ_).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
          -0x5555555555555555;
  local_20 = t;
  local_1c = s;
  if (uVar7 <= uVar5 && uVar5 - uVar7 != 0) {
    pvVar2 = pvVar2 + uVar7;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                      (*(undefined8 *)
                        &(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl,
                       *(pointer *)
                        ((long)&(pvVar2->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl + 8),&local_20);
    puVar1 = _Var4._M_current + 1;
    puVar6 = *(pointer *)
              ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl + 8);
    if (puVar1 != puVar6) {
      memmove(_Var4._M_current,puVar1,(long)puVar6 - (long)puVar1);
      puVar6 = *(pointer *)
                ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl + 8);
    }
    *(uint **)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl + 8) = puVar6 + -1;
    uVar7 = (ulong)local_20;
    pvVar2 = (this->pred_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->pred_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
            -0x5555555555555555;
    if (uVar7 <= uVar5 && uVar5 - uVar7 != 0) {
      pvVar2 = pvVar2 + uVar7;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                         *(pointer *)
                          ((long)&(pvVar2->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data + 8),&local_1c);
      puVar1 = _Var4._M_current + 1;
      puVar6 = *(pointer *)
                ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data + 8);
      if (puVar1 != puVar6) {
        memmove(_Var4._M_current,puVar1,(long)puVar6 - (long)puVar1);
        puVar6 = *(pointer *)
                  ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data + 8);
      }
      *(uint **)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data + 8) = puVar6 + -1;
      puVar3 = (this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (long)(this->deg_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
      if (local_1c < uVar5) {
        puVar3[local_1c] = puVar3[local_1c] - 1;
        if (local_20 < uVar5) {
          puVar3[local_20] = puVar3[local_20] - 1;
          return;
        }
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void Graph::remove_edge(vertex_t s, vertex_t t) {
    // TODO check existence
    succ_.at(s).erase(find(succ_.at(s).begin(), succ_.at(s).end(), t));
    pred_.at(t).erase(find(pred_.at(t).begin(), pred_.at(t).end(), s));

    --deg_.at(s);
    --deg_.at(t);
}